

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-open.c
# Opt level: O3

int run_test_udp_open_bound(void)

{
  int iVar1;
  uint uVar2;
  int extraout_EAX;
  undefined8 uVar3;
  undefined1 *puVar4;
  ulong unaff_RBX;
  undefined1 *puVar5;
  sockaddr_in addr;
  uv_udp_t client;
  undefined1 auStack_578 [16];
  undefined1 auStack_566 [18];
  undefined8 uStack_554;
  undefined8 uStack_54c;
  undefined8 uStack_544;
  undefined8 uStack_53c;
  undefined8 uStack_534;
  undefined8 uStack_52c;
  undefined8 uStack_524;
  undefined8 uStack_51c;
  undefined8 uStack_514;
  undefined4 uStack_50c;
  undefined4 uStack_508;
  undefined4 uStack_504;
  undefined8 uStack_500;
  undefined1 auStack_4f8 [216];
  undefined1 auStack_420 [320];
  ulong uStack_2e0;
  undefined1 auStack_2d0 [16];
  sockaddr sStack_2c0;
  undefined1 auStack_2b0 [96];
  long lStack_250;
  undefined1 auStack_1d8 [216];
  code *pcStack_100;
  sockaddr local_f0;
  undefined1 local_e0 [216];
  
  pcStack_100 = (code *)0x17b437;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&local_f0);
  if (iVar1 == 0) {
    pcStack_100 = (code *)0x17b444;
    uVar2 = create_udp_socket();
    unaff_RBX = (ulong)uVar2;
    pcStack_100 = (code *)0x17b457;
    iVar1 = bind(uVar2,&local_f0,0x10);
    if (iVar1 != 0) goto LAB_0017b508;
    pcStack_100 = (code *)0x17b464;
    uVar3 = uv_default_loop();
    pcStack_100 = (code *)0x17b471;
    iVar1 = uv_udp_init(uVar3,local_e0);
    if (iVar1 != 0) goto LAB_0017b50d;
    pcStack_100 = (code *)0x17b485;
    iVar1 = uv_udp_open(local_e0,uVar2);
    if (iVar1 != 0) goto LAB_0017b512;
    pcStack_100 = (code *)0x17b4a5;
    iVar1 = uv_udp_recv_start(local_e0,alloc_cb,recv_cb);
    if (iVar1 != 0) goto LAB_0017b517;
    pcStack_100 = (code *)0x17b4b5;
    uv_close(local_e0,0);
    pcStack_100 = (code *)0x17b4ba;
    uVar3 = uv_default_loop();
    pcStack_100 = (code *)0x17b4c4;
    uv_run(uVar3,0);
    pcStack_100 = (code *)0x17b4c9;
    unaff_RBX = uv_default_loop();
    pcStack_100 = (code *)0x17b4dd;
    uv_walk(unaff_RBX,close_walk_cb,0);
    pcStack_100 = (code *)0x17b4e7;
    uv_run(unaff_RBX,0);
    pcStack_100 = (code *)0x17b4ec;
    uVar3 = uv_default_loop();
    pcStack_100 = (code *)0x17b4f4;
    iVar1 = uv_loop_close(uVar3);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    pcStack_100 = (code *)0x17b508;
    run_test_udp_open_bound_cold_1();
LAB_0017b508:
    pcStack_100 = (code *)0x17b50d;
    run_test_udp_open_bound_cold_2();
LAB_0017b50d:
    pcStack_100 = (code *)0x17b512;
    run_test_udp_open_bound_cold_3();
LAB_0017b512:
    pcStack_100 = (code *)0x17b517;
    run_test_udp_open_bound_cold_4();
LAB_0017b517:
    pcStack_100 = (code *)0x17b51c;
    run_test_udp_open_bound_cold_5();
  }
  pcStack_100 = run_test_udp_open_connect;
  run_test_udp_open_bound_cold_6();
  pcStack_100 = (code *)unaff_RBX;
  auStack_2d0 = uv_buf_init("PING",4);
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&sStack_2c0);
  if (iVar1 == 0) {
    uVar2 = create_udp_socket();
    unaff_RBX = (ulong)uVar2;
    uVar3 = uv_default_loop();
    iVar1 = uv_udp_init(uVar3,auStack_2b0);
    if (iVar1 != 0) goto LAB_0017b6a6;
    iVar1 = connect(uVar2,&sStack_2c0,0x10);
    if (iVar1 != 0) goto LAB_0017b6ab;
    iVar1 = uv_udp_open(auStack_2b0,uVar2);
    if (iVar1 != 0) goto LAB_0017b6b0;
    uVar3 = uv_default_loop();
    iVar1 = uv_udp_init(uVar3,auStack_1d8);
    if (iVar1 != 0) goto LAB_0017b6b5;
    iVar1 = uv_udp_bind(auStack_1d8,&sStack_2c0,0);
    if (iVar1 != 0) goto LAB_0017b6ba;
    iVar1 = uv_udp_recv_start(auStack_1d8,alloc_cb,recv_cb);
    if (iVar1 != 0) goto LAB_0017b6bf;
    iVar1 = uv_udp_send(&send_req,auStack_2b0,auStack_2d0,1,0,send_cb);
    if (iVar1 != 0) goto LAB_0017b6c4;
    uVar3 = uv_default_loop();
    uv_run(uVar3,0);
    if (send_cb_called != 1) goto LAB_0017b6c9;
    if (close_cb_called != 2) goto LAB_0017b6ce;
    if (lStack_250 != 0) goto LAB_0017b6d3;
    unaff_RBX = uv_default_loop();
    uv_walk(unaff_RBX,close_walk_cb,0);
    uv_run(unaff_RBX,0);
    uVar3 = uv_default_loop();
    iVar1 = uv_loop_close(uVar3);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    run_test_udp_open_connect_cold_1();
LAB_0017b6a6:
    run_test_udp_open_connect_cold_2();
LAB_0017b6ab:
    run_test_udp_open_connect_cold_3();
LAB_0017b6b0:
    run_test_udp_open_connect_cold_4();
LAB_0017b6b5:
    run_test_udp_open_connect_cold_5();
LAB_0017b6ba:
    run_test_udp_open_connect_cold_6();
LAB_0017b6bf:
    run_test_udp_open_connect_cold_7();
LAB_0017b6c4:
    run_test_udp_open_connect_cold_8();
LAB_0017b6c9:
    run_test_udp_open_connect_cold_9();
LAB_0017b6ce:
    run_test_udp_open_connect_cold_10();
LAB_0017b6d3:
    run_test_udp_open_connect_cold_11();
  }
  run_test_udp_open_connect_cold_12();
  uStack_2e0 = unaff_RBX;
  auStack_578 = uv_buf_init("PING",4);
  puVar4 = (undefined1 *)uv_default_loop();
  uStack_54c = 0;
  uStack_544 = 0;
  uStack_53c = 0;
  uStack_534 = 0;
  uStack_52c = 0;
  uStack_524 = 0;
  uStack_51c = 0;
  uStack_514 = 0;
  uStack_50c = 0;
  uStack_508 = 0;
  uStack_504 = 0;
  uStack_500 = 0;
  auStack_566._0_2_ = 1;
  auStack_566[2] = '/';
  auStack_566[3] = 't';
  auStack_566[4] = 'm';
  auStack_566[5] = 'p';
  auStack_566[6] = '/';
  auStack_566[7] = 'u';
  auStack_566[8] = 'v';
  auStack_566[9] = '-';
  auStack_566[10] = 't';
  auStack_566[0xb] = 'e';
  auStack_566[0xc] = 's';
  auStack_566[0xd] = 't';
  auStack_566[0xe] = '-';
  auStack_566[0xf] = 's';
  auStack_566[0x10] = 'o';
  auStack_566[0x11] = 'c';
  uStack_554 = 0x6b;
  puVar5 = (undefined1 *)0x1;
  uVar2 = socket(1,1,0);
  if ((int)uVar2 < 0) {
    run_test_udp_send_unix_cold_1();
LAB_0017b86c:
    run_test_udp_send_unix_cold_2();
LAB_0017b871:
    run_test_udp_send_unix_cold_3();
LAB_0017b876:
    run_test_udp_send_unix_cold_4();
LAB_0017b87b:
    run_test_udp_send_unix_cold_5();
  }
  else {
    unlink("/tmp/uv-test-sock");
    puVar5 = (undefined1 *)(ulong)uVar2;
    iVar1 = bind(uVar2,(sockaddr *)auStack_566,0x6e);
    if (iVar1 != 0) goto LAB_0017b86c;
    puVar5 = (undefined1 *)(ulong)uVar2;
    iVar1 = listen(uVar2,1);
    if (iVar1 != 0) goto LAB_0017b871;
    puVar5 = puVar4;
    iVar1 = uv_udp_init(puVar4,auStack_4f8);
    if (iVar1 != 0) goto LAB_0017b876;
    puVar5 = auStack_4f8;
    iVar1 = uv_udp_open(puVar5,uVar2);
    if (iVar1 != 0) goto LAB_0017b87b;
    uv_run(puVar4,0);
    puVar5 = auStack_420;
    iVar1 = uv_udp_send(puVar5,auStack_4f8,auStack_578,1,auStack_566,0);
    if (iVar1 == 0) {
      uv_close(auStack_4f8,0);
      uv_run(puVar4,0);
      close(uVar2);
      unlink("/tmp/uv-test-sock");
      uVar3 = uv_default_loop();
      uv_walk(uVar3,close_walk_cb,0);
      uv_run(uVar3,0);
      puVar5 = (undefined1 *)uv_default_loop();
      iVar1 = uv_loop_close();
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_0017b885;
    }
  }
  run_test_udp_send_unix_cold_6();
LAB_0017b885:
  run_test_udp_send_unix_cold_7();
  if (puVar5 != (undefined1 *)0x0) {
    close_cb_called = close_cb_called + 1;
    return extraout_EAX;
  }
  close_cb_cold_1();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = uv_close(puVar5,0);
  return iVar1;
}

Assistant:

TEST_IMPL(udp_open_bound) {
  struct sockaddr_in addr;
  uv_udp_t client;
  uv_os_sock_t sock;
  int r;

  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  startup();
  sock = create_udp_socket();

  r = bind(sock, (struct sockaddr*) &addr, sizeof(addr));
  ASSERT(r == 0);

  r = uv_udp_init(uv_default_loop(), &client);
  ASSERT(r == 0);

  r = uv_udp_open(&client, sock);
  ASSERT(r == 0);

  r = uv_udp_recv_start(&client, alloc_cb, recv_cb);
  ASSERT(r == 0);

  uv_close((uv_handle_t*) &client, NULL);
  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  MAKE_VALGRIND_HAPPY();
  return 0;
}